

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void sysbvm_dwarf_debugInfo_line_setAddress
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t value)

{
  size_t sVar1;
  undefined4 local_1c;
  uintptr_t uStack_18;
  uint32_t addressOffset;
  uintptr_t value_local;
  sysbvm_dwarf_debugInfo_builder_t *builder_local;
  
  uStack_18 = value;
  value_local = (uintptr_t)builder;
  sysbvm_dwarf_encodeByte(&builder->line,'\0');
  sysbvm_dwarf_encodeULEB128((sysbvm_dynarray_t *)(value_local + 0x60),9);
  sysbvm_dwarf_encodeByte((sysbvm_dynarray_t *)(value_local + 0x60),'\x02');
  sVar1 = sysbvm_dwarf_encodePointer((sysbvm_dynarray_t *)(value_local + 0x60),uStack_18);
  local_1c = (undefined4)sVar1;
  sysbvm_dynarray_add((sysbvm_dynarray_t *)(value_local + 0xe0),&local_1c);
  *(int *)(value_local + 0x18) = (int)uStack_18;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_line_setAddress(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t value)
{
    sysbvm_dwarf_encodeByte(&builder->line, 0);
    sysbvm_dwarf_encodeULEB128(&builder->line, 1 + sizeof(value));
    sysbvm_dwarf_encodeByte(&builder->line, DW_LNE_set_address);
    uint32_t addressOffset = (uint32_t)sysbvm_dwarf_encodePointer(&builder->line, value);
    sysbvm_dynarray_add(&builder->lineTextAddresses, &addressOffset);
    builder->lineProgramState.regAddress = (uint32_t)value;
}